

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

void vkb::detail::setup_pNext_chain<VkDeviceCreateInfo>
               (VkDeviceCreateInfo *structure,
               vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *structs)

{
  pointer ppVVar1;
  long lVar2;
  long lVar3;
  
  structure->pNext = (void *)0x0;
  ppVVar1 = (structs->
            super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  lVar2 = (long)(structs->
                super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    if (lVar2 != 1) {
      lVar3 = 1;
      do {
        if (lVar2 + (ulong)(lVar2 == 0) == lVar3) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        ppVVar1[lVar3 + -1]->pNext = ppVVar1[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    structure->pNext = *ppVVar1;
  }
  return;
}

Assistant:

void setup_pNext_chain(T& structure, std::vector<VkBaseOutStructure*> const& structs) {
    structure.pNext = nullptr;
    if (structs.size() <= 0) return;
    for (size_t i = 0; i < structs.size() - 1; i++) {
        structs.at(i)->pNext = structs.at(i + 1);
    }
    structure.pNext = structs.at(0);
}